

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

void __thiscall BufferedReader::thread_main(BufferedReader *this)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint uVar4;
  ReaderData *pRVar5;
  ulong uVar6;
  exception *e;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> lk;
  string nextFileName;
  int bytesReaded;
  uint8_t *buffer;
  ReaderData *data;
  int local_14;
  BufferedReader *pBStack_10;
  int readerID;
  BufferedReader *this_local;
  
  pBStack_10 = this;
  while ((((this->m_terminated ^ 0xffU) & 1) != 0 &&
         (local_14 = WaitableSafeQueue<int>::pop(&this->m_readQueue), (this->m_terminated & 1U) == 0
         ))) {
    pRVar5 = getReader(this,local_14);
    if (pRVar5 != (ReaderData *)0x0) {
      puVar2 = pRVar5->m_nextBlock[pRVar5->m_bufferIndex];
      iVar1 = pRVar5->m_readOffset;
      if ((pRVar5->m_deleted & 1U) == 0) {
        nextFileName.field_2._12_4_ =
             (*pRVar5->_vptr_ReaderData[5])(pRVar5,puVar2 + iVar1,(ulong)pRVar5->m_blockSize);
        if ((pRVar5->m_lastBlock & 1U) == 0) {
          if ((pRVar5->m_firstBlock & 1U) != 0) {
            pRVar5->m_firstBlock = false;
          }
        }
        else {
          pRVar5->m_lastBlock = false;
          pRVar5->m_firstBlock = true;
        }
        if (((int)nextFileName.field_2._12_4_ < 1) ||
           (((int)nextFileName.field_2._12_4_ < (int)pRVar5->m_blockSize &&
            (pRVar5->itr != (FileNameIterator *)0x0)))) {
          if (pRVar5->itr == (FileNameIterator *)0x0) {
            pRVar5->m_eof = true;
          }
          else {
            (**pRVar5->itr->_vptr_FileNameIterator)(&lk);
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&lk,&pRVar5->m_streamName);
            if (bVar3) {
              (*pRVar5->_vptr_ReaderData[6])();
              std::__cxx11::string::operator=((string *)&pRVar5->m_streamName,(string *)&lk);
              uVar6 = std::__cxx11::string::empty();
              if (((uVar6 & 1) == 0) && (uVar4 = (*pRVar5->_vptr_ReaderData[4])(), (uVar4 & 1) != 0)
                 ) {
                if (nextFileName.field_2._12_4_ == 0) {
                  pRVar5->m_firstBlock = true;
                  nextFileName.field_2._12_4_ =
                       (*pRVar5->_vptr_ReaderData[5])
                                 (pRVar5,puVar2 + iVar1,
                                  (ulong)(this->super_AbstractReader).m_blockSize);
                  if ((int)nextFileName.field_2._12_4_ <
                      (int)(this->super_AbstractReader).m_blockSize) {
                    pRVar5->m_eof = true;
                    pRVar5->m_lastBlock = true;
                  }
                }
                else {
                  pRVar5->m_lastBlock = true;
                }
              }
              else {
                pRVar5->m_eof = true;
              }
            }
            std::__cxx11::string::~string((string *)&lk);
          }
        }
        pRVar5->m_blockSize = (this->super_AbstractReader).m_blockSize;
        if (nextFileName.field_2._12_4_ == 0) {
          pRVar5->m_eof = true;
        }
        std::lock_guard<std::mutex>::lock_guard(&lock,&this->m_readMtx);
        pRVar5->m_nextBlockSize = nextFileName.field_2._12_4_;
        std::condition_variable::notify_one();
        std::lock_guard<std::mutex>::~lock_guard(&lock);
      }
      std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&e,&this->m_readersMtx);
      pRVar5->m_atQueue = pRVar5->m_atQueue + -1;
      if (((pRVar5->m_deleted & 1U) != 0) && (pRVar5->m_atQueue == 0)) {
        if (pRVar5 != (ReaderData *)0x0) {
          (*pRVar5->_vptr_ReaderData[1])();
        }
        std::
        map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
        ::erase(&this->m_readers,&local_14);
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&e);
    }
  }
  return;
}

Assistant:

void BufferedReader::thread_main()
{
    try
    {
        while (!m_terminated)
        {
            const int readerID = m_readQueue.pop();
            if (m_terminated)
            {
                break;
            }
            ReaderData* data = getReader(readerID);
            if (data)
            {
                uint8_t* buffer = data->m_nextBlock[data->m_bufferIndex] + data->m_readOffset;
                if (!data->m_deleted)
                {
                    int bytesReaded = data->readBlock(buffer, data->m_blockSize);
                    if (data->m_lastBlock)
                    {
                        data->m_lastBlock = false;
                        data->m_firstBlock = true;
                    }
                    else if (data->m_firstBlock)
                    {
                        data->m_firstBlock = false;
                    }

                    if (bytesReaded <= 0 || (bytesReaded < static_cast<int>(data->m_blockSize) && data->itr))
                    {
                        if (data->itr)
                        {
                            std::string nextFileName = data->itr->getNextName();
                            if (nextFileName != data->m_streamName)
                            {
                                data->closeStream();
                                data->m_streamName = nextFileName;
                                if (!data->m_streamName.empty() && data->openStream())
                                {
                                    if (bytesReaded == 0)
                                    {
                                        // data->m_nextFileInfo = NEXT_FILE_FIRST_BLOCK;
                                        data->m_firstBlock = true;
                                        bytesReaded = data->readBlock(buffer, m_blockSize);
                                        if (bytesReaded < static_cast<int>(m_blockSize))
                                        {
                                            data->m_eof = true;
                                            data->m_lastBlock = true;
                                        }
                                    }
                                    else
                                    {
                                        data->m_lastBlock = true;
                                    }
                                }
                                else
                                    data->m_eof = true;
                            }
                        }
                        else
                        {
                            data->m_eof = true;
                        }
                    }

                    data->m_blockSize = m_blockSize;
                    if (bytesReaded == 0)
                    {
                        data->m_eof = true;
                    }

                    {
                        std::lock_guard lk(m_readMtx);
                        data->m_nextBlockSize = bytesReaded;
                        m_readCond.notify_one();
                    }
                }

                {
                    std::lock_guard lock(m_readersMtx);
                    data->m_atQueue--;
                    if (data->m_deleted && data->m_atQueue == 0)
                    {
                        delete data;
                        m_readers.erase(readerID);
                    }
                }
            }
        }
    }
    catch (std::exception& e)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws exception: " << e.what());
    }
    catch (...)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws unknown exception");
    }
}